

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL> * __thiscall
soul::StructuralParser::parseEndpointTypeList
          (ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL>
           *__return_storage_ptr__,StructuralParser *this,EndpointType endpointType)

{
  bool bVar1;
  pool_ref<soul::AST::Expression> local_80;
  CodeLocation loc;
  CompileMessage local_68;
  
  __return_storage_ptr__->items = (pool_ref<soul::AST::Expression> *)__return_storage_ptr__->space;
  __return_storage_ptr__->numActive = 0;
  __return_storage_ptr__->numAllocated = 2;
  loc.sourceCode.object = (this->super_SOULTokeniser).location.sourceCode.object;
  if (loc.sourceCode.object != (SourceCodeText *)0x0) {
    ((loc.sourceCode.object)->super_RefCountedObject).refCount =
         ((loc.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  loc.location.data = (this->super_SOULTokeniser).location.location.data;
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2c8be9);
  if (bVar1) {
    while( true ) {
      local_80.object = parseType(this,eventType);
      ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL>::push_back
                (__return_storage_ptr__,&local_80);
      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2c67cb);
      if (bVar1) break;
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a3519);
    }
  }
  else {
    local_80.object = parseType(this,eventType);
    ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL>::push_back
              (__return_storage_ptr__,&local_80);
  }
  if ((endpointType != event) && (1 < __return_storage_ptr__->numActive)) {
    Errors::noMultipleTypesOnEndpoint<>();
    CodeLocation::throwError(&loc,&local_68);
  }
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&loc.sourceCode);
  return __return_storage_ptr__;
}

Assistant:

decltype (AST::EndpointDetails::dataTypes) parseEndpointTypeList (EndpointType endpointType)
    {
        decltype (AST::EndpointDetails::dataTypes) result;
        auto loc = location;

        if (matchIf (Operator::openParen))
        {
            for (;;)
            {
                result.push_back (parseType (ParseTypeContext::eventType));

                if (matchIf (Operator::closeParen))
                    break;

                expect (Operator::comma);
            }
        }
        else
        {
            result.push_back (parseType (ParseTypeContext::eventType));
        }

        if (! isEvent (endpointType) && result.size() > 1)
            loc.throwError (Errors::noMultipleTypesOnEndpoint());

        return result;
    }